

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cc
# Opt level: O2

string * __thiscall
FileWriter::buildFilename_abi_cxx11_(string *__return_storage_ptr__,FileWriter *this,time_t t)

{
  char *__format;
  pointer __s;
  tm *__tp;
  size_t sVar1;
  vector<char,_std::allocator<char>_> tsbuf;
  allocator_type local_51;
  _Vector_base<char,_std::allocator<char>_> local_50;
  time_t local_38;
  
  local_38 = t;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_50,0x100,&local_51);
  __s = local_50._M_impl.super__Vector_impl_data._M_start;
  sVar1 = (long)local_50._M_impl.super__Vector_impl_data._M_finish -
          (long)local_50._M_impl.super__Vector_impl_data._M_start;
  __format = (this->pattern_)._M_dataplus._M_p;
  __tp = gmtime(&local_38);
  sVar1 = strftime(__s,sVar1,__format,__tp);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_50._M_impl.super__Vector_impl_data._M_start,
             local_50._M_impl.super__Vector_impl_data._M_start + sVar1);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string FileWriter::buildFilename(time_t t) {
  std::vector<char> tsbuf(256);
  auto len = strftime(
    tsbuf.data(),
    tsbuf.size(),
    pattern_.c_str(),
    gmtime(&t));
  return std::string(tsbuf.data(), len);
}